

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm.cpp
# Opt level: O1

int __thiscall
ncnn::LSTM::forward(LSTM *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
                   vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint _h;
  uint reverse;
  Mat *bottom_blob;
  Allocator *_allocator;
  Mat *this_00;
  pointer pMVar1;
  int *piVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  ulong uVar7;
  void *__dest;
  void *in_R8;
  int _h_00;
  void *__src;
  Mat m;
  Mat m_10;
  Mat m_11;
  Mat m_1;
  Mat m_9;
  Mat m_8;
  Mat m_2;
  Mat m_3;
  Mat local_178;
  Mat local_128;
  Mat m_18;
  Mat m_19;
  
  bottom_blob = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
  _h = bottom_blob->h;
  iVar4 = this->direction;
  local_128.cstep = 0;
  local_128.data = (void *)0x0;
  local_128.refcount._0_4_ = 0;
  local_128.refcount._4_4_ = 0;
  local_128.elemsize._0_4_ = 0;
  local_128.elemsize._4_4_ = 0;
  local_128.elempack = 0;
  local_128.allocator = (Allocator *)0x0;
  local_128.dims = 0;
  local_128.w = 0;
  local_128.h = 0;
  local_128.d = 0;
  local_128.c = 0;
  local_178.cstep = 0;
  local_178.data = (void *)0x0;
  local_178.refcount._0_4_ = 0;
  local_178.refcount._4_4_ = 0;
  local_178.elemsize._0_4_ = 0;
  local_178.elemsize._4_4_ = 0;
  local_178.elempack = 0;
  local_178.allocator = (Allocator *)0x0;
  local_178.dims = 0;
  local_178.w = 0;
  local_178.h = 0;
  local_178.d = 0;
  local_178.c = 0;
  _allocator = (&opt->blob_allocator)
               [(long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_finish -
                (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_start != 0xd8];
  if ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)bottom_blob == 0xd8) {
    Mat::clone(&m,(__fn *)(bottom_blob + 1),_allocator,0xd8,in_R8);
    piVar2 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_128.allocator == (Allocator *)0x0) {
          if (local_128.data != (void *)0x0) {
            free(local_128.data);
          }
        }
        else {
          (*(local_128.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar2 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    local_128.data = m.data;
    local_128.refcount._0_4_ = m.refcount._0_4_;
    local_128.refcount._4_4_ = m.refcount._4_4_;
    local_128.elemsize._0_4_ = (undefined4)m.elemsize;
    local_128.elemsize._4_4_ = m.elemsize._4_4_;
    local_128.elempack = m.elempack;
    local_128.allocator = m.allocator;
    local_128.dims = m.dims;
    local_128.w = m.w;
    local_128.h = m.h;
    local_128.d = m.d;
    local_128.c = m.c;
    local_128.cstep = m.cstep;
    sVar6 = m.cstep;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (m.allocator == (Allocator *)0x0) {
          if (m.data != (void *)0x0) {
            free(m.data);
            sVar6 = m.cstep;
          }
        }
        else {
          (*(m.allocator)->_vptr_Allocator[3])();
          sVar6 = m.cstep;
        }
      }
    }
    m.cstep = 0;
    m.data = (void *)0x0;
    m.refcount._0_4_ = 0;
    m.refcount._4_4_ = 0;
    m.elemsize._0_4_ = 0;
    m.elemsize._4_4_ = 0;
    m.elempack = 0;
    m.dims = 0;
    m.w = 0;
    m.h = 0;
    m.d = 0;
    m.c = 0;
    Mat::clone(&m,(__fn *)((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)
                           ._M_impl.super__Vector_impl_data._M_start + 2),_allocator,(int)sVar6,
               in_R8);
    piVar2 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_178.allocator == (Allocator *)0x0) {
          if (local_178.data != (void *)0x0) {
            free(local_178.data);
          }
        }
        else {
          (*(local_178.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar2 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    local_178.data = m.data;
    local_178.refcount._0_4_ = m.refcount._0_4_;
    local_178.refcount._4_4_ = m.refcount._4_4_;
    local_178.elemsize._0_4_ = (undefined4)m.elemsize;
    local_178.elemsize._4_4_ = m.elemsize._4_4_;
    local_178.elempack = m.elempack;
    local_178.allocator = m.allocator;
    local_178.dims = m.dims;
    local_178.w = m.w;
    local_178.h = m.h;
    local_178.d = m.d;
    local_178.c = m.c;
    local_178.cstep = m.cstep;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (m.allocator == (Allocator *)0x0) {
          if (m.data != (void *)0x0) {
            free(m.data);
          }
        }
        else {
          (*(m.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    m.cstep = 0;
    m.data = (void *)0x0;
    m.refcount._0_4_ = 0;
    m.refcount._4_4_ = 0;
    m.elemsize._0_4_ = 0;
    m.elemsize._4_4_ = 0;
    m.elempack = 0;
    m.dims = 0;
    m.w = 0;
    m.h = 0;
    m.d = 0;
    m.c = 0;
  }
  else {
    _h_00 = (iVar4 == 2) + 1;
    Mat::create(&local_128,this->num_output,_h_00,4,_allocator);
    iVar5 = -100;
    if ((local_128.data == (void *)0x0) || ((long)local_128.c * local_128.cstep == 0))
    goto LAB_00377afb;
    if (0 < local_128.c * (int)local_128.cstep) {
      memset(local_128.data,0,(ulong)(uint)(local_128.c * (int)local_128.cstep) << 2);
    }
    Mat::create(&local_178,this->hidden_size,_h_00,4,_allocator);
    if ((local_178.data == (void *)0x0) || ((long)local_178.c * local_178.cstep == 0))
    goto LAB_00377afb;
    if (0 < local_178.c * (int)local_178.cstep) {
      memset(local_178.data,0,(ulong)(uint)(local_178.c * (int)local_178.cstep) << 2);
    }
  }
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create(this_00,this->num_output << (iVar4 == 2),_h,4,opt->blob_allocator);
  iVar5 = -100;
  if ((this_00->data == (void *)0x0) || ((long)this_00->c * this_00->cstep == 0)) goto LAB_00377afb;
  reverse = this->direction;
  if (reverse < 2) {
    if (this->int8_scale_term == 0) {
      m.w = (this->weight_xc_data).w;
      m.h = (this->weight_xc_data).h;
      m.c = (this->weight_xc_data).d;
      m.data = (this->weight_xc_data).data;
      uVar7 = (this->weight_xc_data).elemsize;
      m.elempack = (this->weight_xc_data).elempack;
      m.allocator = (this->weight_xc_data).allocator;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize._0_4_ = (undefined4)uVar7;
      m.elemsize._4_4_ = (undefined4)(uVar7 >> 0x20);
      m.d = 1;
      iVar4 = (this->weight_xc_data).dims;
      m.dims = iVar4 + -1;
      m.cstep = (uVar7 * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / uVar7;
      if (iVar4 == 4) {
        m.cstep = (long)m.h * (long)m.w;
      }
      m_1.w = (this->bias_c_data).w;
      m_1.h = (this->bias_c_data).h;
      m_1.c = (this->bias_c_data).d;
      m_1.data = (this->bias_c_data).data;
      uVar7 = (this->bias_c_data).elemsize;
      m_1.elempack = (this->bias_c_data).elempack;
      m_1.allocator = (this->bias_c_data).allocator;
      m_1.refcount._0_4_ = 0;
      m_1.refcount._4_4_ = 0;
      m_1.elemsize._0_4_ = (undefined4)uVar7;
      m_1.elemsize._4_4_ = (undefined4)(uVar7 >> 0x20);
      m_1.d = 1;
      iVar4 = (this->bias_c_data).dims;
      m_1.dims = iVar4 + -1;
      m_1.cstep = (uVar7 * (long)m_1.h * (long)m_1.w + 0xf & 0xfffffffffffffff0) / uVar7;
      if (iVar4 == 4) {
        m_1.cstep = (long)m_1.h * (long)m_1.w;
      }
      m_2.w = (this->weight_hc_data).w;
      m_2.h = (this->weight_hc_data).h;
      m_2.c = (this->weight_hc_data).d;
      m_2.data = (this->weight_hc_data).data;
      uVar7 = (this->weight_hc_data).elemsize;
      m_2.elempack = (this->weight_hc_data).elempack;
      m_2.allocator = (this->weight_hc_data).allocator;
      m_2.refcount._0_4_ = 0;
      m_2.refcount._4_4_ = 0;
      m_2.elemsize._0_4_ = (undefined4)uVar7;
      m_2.elemsize._4_4_ = (undefined4)(uVar7 >> 0x20);
      m_2.d = 1;
      sVar6 = (long)m_2.h * (long)m_2.w;
      iVar4 = (this->weight_hc_data).dims;
      m_2.dims = iVar4 + -1;
      m_2.cstep = (uVar7 * sVar6 + 0xf & 0xfffffffffffffff0) / uVar7;
      if (iVar4 == 4) {
        m_2.cstep = sVar6;
      }
      if (this->num_output == this->hidden_size) {
        m_3.cstep = 0;
        m_3.data = (void *)0x0;
        m_3.elemsize._0_4_ = 0;
        m_3.elemsize._4_4_ = 0;
        m_3.elempack = 0;
        m_3.allocator = (Allocator *)0x0;
        m_3.dims = 0;
        m_3.w = 0;
        m_3.h = 0;
        m_3.d = 0;
        m_3.c = 0;
      }
      else {
        m_3.w = (this->weight_hr_data).w;
        m_3.h = (this->weight_hr_data).h;
        m_3.c = (this->weight_hr_data).d;
        m_3.data = (this->weight_hr_data).data;
        uVar7 = (this->weight_hr_data).elemsize;
        m_3.elempack = (this->weight_hr_data).elempack;
        m_3.allocator = (this->weight_hr_data).allocator;
        m_3.elemsize._0_4_ = (undefined4)uVar7;
        m_3.elemsize._4_4_ = (undefined4)(uVar7 >> 0x20);
        m_3.d = 1;
        iVar4 = (this->weight_hr_data).dims;
        m_3.dims = iVar4 + -1;
        m_3.cstep = (uVar7 * (long)m_3.h * (long)m_3.w + 0xf & 0xfffffffffffffff0) / uVar7;
        if (iVar4 == 4) {
          m_3.cstep = (long)m_3.h * (long)m_3.w;
        }
      }
      m_3.refcount._4_4_ = 0;
      m_3.refcount._0_4_ = 0;
      iVar4 = lstm(bottom_blob,this_00,reverse,&m,&m_1,&m_2,&m_3,&local_128,&local_178,opt);
      piVar2 = (int *)CONCAT44(m_3.refcount._4_4_,m_3.refcount._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (m_3.allocator == (Allocator *)0x0) {
            if (m_3.data != (void *)0x0) {
              free(m_3.data);
            }
          }
          else {
            (*(m_3.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar2 = (int *)CONCAT44(m_2.refcount._4_4_,m_2.refcount._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (m_2.allocator == (Allocator *)0x0) {
            if (m_2.data != (void *)0x0) {
              free(m_2.data);
            }
          }
          else {
            (*(m_2.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      m_2.cstep = 0;
      m_2.data = (void *)0x0;
      m_2.refcount._0_4_ = 0;
      m_2.refcount._4_4_ = 0;
      m_2.elemsize._0_4_ = 0;
      m_2.elemsize._4_4_ = 0;
      m_2.elempack = 0;
      m_2.dims = 0;
      m_2.w = 0;
      m_2.h = 0;
      m_2.d = 0;
      m_2.c = 0;
      piVar2 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (m_1.allocator == (Allocator *)0x0) {
            if (m_1.data != (void *)0x0) {
              free(m_1.data);
            }
          }
          else {
            (*(m_1.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      m_1.cstep = 0;
      m_1.data = (void *)0x0;
      m_1.refcount._0_4_ = 0;
      m_1.refcount._4_4_ = 0;
      m_1.elemsize._0_4_ = 0;
      m_1.elemsize._4_4_ = 0;
      m_1.elempack = 0;
      m_1.dims = 0;
      m_1.w = 0;
      m_1.h = 0;
      m_1.d = 0;
      m_1.c = 0;
      piVar2 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (m.allocator == (Allocator *)0x0) {
            if (m.data != (void *)0x0) {
              free(m.data);
            }
          }
          else {
            (*(m.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      m.w = (this->weight_xc_data).w;
      m.h = (this->weight_xc_data).h;
      m.c = (this->weight_xc_data).d;
      m.data = (this->weight_xc_data).data;
      uVar7 = (this->weight_xc_data).elemsize;
      m.elempack = (this->weight_xc_data).elempack;
      m.allocator = (this->weight_xc_data).allocator;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize._0_4_ = (undefined4)uVar7;
      m.elemsize._4_4_ = (undefined4)(uVar7 >> 0x20);
      m.d = 1;
      iVar4 = (this->weight_xc_data).dims;
      m.dims = iVar4 + -1;
      m.cstep = (uVar7 * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / uVar7;
      if (iVar4 == 4) {
        m.cstep = (long)m.h * (long)m.w;
      }
      m_1.w = (this->bias_c_data).w;
      m_1.h = (this->bias_c_data).h;
      m_1.c = (this->bias_c_data).d;
      m_1.data = (this->bias_c_data).data;
      uVar7 = (this->bias_c_data).elemsize;
      m_1.elempack = (this->bias_c_data).elempack;
      m_1.allocator = (this->bias_c_data).allocator;
      m_1.refcount._0_4_ = 0;
      m_1.refcount._4_4_ = 0;
      m_1.elemsize._0_4_ = (undefined4)uVar7;
      m_1.elemsize._4_4_ = (undefined4)(uVar7 >> 0x20);
      m_1.d = 1;
      iVar4 = (this->bias_c_data).dims;
      m_1.dims = iVar4 + -1;
      m_1.cstep = (uVar7 * (long)m_1.h * (long)m_1.w + 0xf & 0xfffffffffffffff0) / uVar7;
      if (iVar4 == 4) {
        m_1.cstep = (long)m_1.h * (long)m_1.w;
      }
      m_2.w = (this->weight_hc_data).w;
      m_2.h = (this->weight_hc_data).h;
      m_2.c = (this->weight_hc_data).d;
      m_2.data = (this->weight_hc_data).data;
      uVar7 = (this->weight_hc_data).elemsize;
      m_2.elempack = (this->weight_hc_data).elempack;
      m_2.allocator = (this->weight_hc_data).allocator;
      m_2.refcount._0_4_ = 0;
      m_2.refcount._4_4_ = 0;
      m_2.elemsize._0_4_ = (undefined4)uVar7;
      m_2.elemsize._4_4_ = (undefined4)(uVar7 >> 0x20);
      m_2.d = 1;
      sVar6 = (long)m_2.h * (long)m_2.w;
      iVar4 = (this->weight_hc_data).dims;
      m_2.dims = iVar4 + -1;
      m_2.cstep = (uVar7 * sVar6 + 0xf & 0xfffffffffffffff0) / uVar7;
      if (iVar4 == 4) {
        m_2.cstep = sVar6;
      }
      if (this->num_output == this->hidden_size) {
        m_3.cstep = 0;
        m_3.data = (void *)0x0;
        m_3.elemsize._0_4_ = 0;
        m_3.elemsize._4_4_ = 0;
        m_3.elempack = 0;
        m_3.allocator = (Allocator *)0x0;
        m_3.dims = 0;
        m_3.w = 0;
        m_3.h = 0;
        m_3.d = 0;
        m_3.c = 0;
      }
      else {
        m_3.w = (this->weight_hr_data).w;
        m_3.h = (this->weight_hr_data).h;
        m_3.c = (this->weight_hr_data).d;
        m_3.data = (this->weight_hr_data).data;
        uVar7 = (this->weight_hr_data).elemsize;
        m_3.elempack = (this->weight_hr_data).elempack;
        m_3.allocator = (this->weight_hr_data).allocator;
        m_3.elemsize._0_4_ = (undefined4)uVar7;
        m_3.elemsize._4_4_ = (undefined4)(uVar7 >> 0x20);
        m_3.d = 1;
        iVar4 = (this->weight_hr_data).dims;
        m_3.dims = iVar4 + -1;
        m_3.cstep = (uVar7 * (long)m_3.h * (long)m_3.w + 0xf & 0xfffffffffffffff0) / uVar7;
        if (iVar4 == 4) {
          m_3.cstep = (long)m_3.h * (long)m_3.w;
        }
      }
      m_3.refcount._4_4_ = 0;
      m_3.refcount._0_4_ = 0;
      iVar4 = lstm_int8(bottom_blob,this_00,reverse,&m,
                        (float *)(this->weight_xc_data_int8_scales).data,&m_1,&m_2,
                        (float *)(this->weight_hc_data_int8_scales).data,&m_3,&local_128,&local_178,
                        opt);
      piVar2 = (int *)CONCAT44(m_3.refcount._4_4_,m_3.refcount._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (m_3.allocator == (Allocator *)0x0) {
            if (m_3.data != (void *)0x0) {
              free(m_3.data);
            }
          }
          else {
            (*(m_3.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar2 = (int *)CONCAT44(m_2.refcount._4_4_,m_2.refcount._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (m_2.allocator == (Allocator *)0x0) {
            if (m_2.data != (void *)0x0) {
              free(m_2.data);
            }
          }
          else {
            (*(m_2.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      m_2.cstep = 0;
      m_2.data = (void *)0x0;
      m_2.refcount._0_4_ = 0;
      m_2.refcount._4_4_ = 0;
      m_2.elemsize._0_4_ = 0;
      m_2.elemsize._4_4_ = 0;
      m_2.elempack = 0;
      m_2.dims = 0;
      m_2.w = 0;
      m_2.h = 0;
      m_2.d = 0;
      m_2.c = 0;
      piVar2 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (m_1.allocator == (Allocator *)0x0) {
            if (m_1.data != (void *)0x0) {
              free(m_1.data);
            }
          }
          else {
            (*(m_1.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      m_1.cstep = 0;
      m_1.data = (void *)0x0;
      m_1.refcount._0_4_ = 0;
      m_1.refcount._4_4_ = 0;
      m_1.elemsize._0_4_ = 0;
      m_1.elemsize._4_4_ = 0;
      m_1.elempack = 0;
      m_1.dims = 0;
      m_1.w = 0;
      m_1.h = 0;
      m_1.d = 0;
      m_1.c = 0;
      piVar2 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (m.allocator == (Allocator *)0x0) {
            if (m.data != (void *)0x0) {
              free(m.data);
            }
          }
          else {
            (*(m.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    m.d = 0;
    m.h = 0;
    m.w = 0;
    m.dims = 0;
    m.elempack = 0;
    m.elemsize._4_4_ = 0;
    m.elemsize._0_4_ = 0;
    m.refcount._4_4_ = 0;
    m.refcount._0_4_ = 0;
    m.c = 0;
    m.data = (void *)0x0;
    m.cstep = 0;
    iVar5 = iVar4;
    if (iVar4 != 0) goto LAB_00377afb;
  }
  if (this->direction == 2) {
    m.cstep = 0;
    m.data = (void *)0x0;
    m.refcount._0_4_ = 0;
    m.refcount._4_4_ = 0;
    m.elemsize._0_4_ = 0;
    m.elemsize._4_4_ = 0;
    m.elempack = 0;
    m.allocator = (Allocator *)0x0;
    m.dims = 0;
    m.w = 0;
    m.h = 0;
    m.d = 0;
    m.c = 0;
    Mat::create(&m,this->num_output,_h,4,opt->workspace_allocator);
    iVar5 = -100;
    if ((m.data == (void *)0x0) || ((long)m.c * m.cstep == 0)) {
      bVar3 = false;
    }
    else {
      m_1.cstep = 0;
      m_1.data = (void *)0x0;
      m_1.refcount._0_4_ = 0;
      m_1.refcount._4_4_ = 0;
      m_1.elemsize._0_4_ = 0;
      m_1.elemsize._4_4_ = 0;
      m_1.elempack = 0;
      m_1.allocator = (Allocator *)0x0;
      m_1.dims = 0;
      m_1.w = 0;
      m_1.h = 0;
      m_1.d = 0;
      m_1.c = 0;
      Mat::create(&m_1,this->num_output,_h,4,opt->workspace_allocator);
      iVar5 = -100;
      if ((m_1.data == (void *)0x0) || ((long)m_1.c * m_1.cstep == 0)) {
        bVar3 = false;
      }
      else {
        m_2.cstep = (size_t)local_128.w;
        m_2.data = local_128.data;
        m_2.refcount._0_4_ = 0;
        m_2.refcount._4_4_ = 0;
        m_2.elemsize._0_4_ = (undefined4)local_128.elemsize;
        m_2.elemsize._4_4_ = local_128.elemsize._4_4_;
        m_2.elempack = local_128.elempack;
        m_2.allocator = local_128.allocator;
        m_2.w = local_128.w;
        m_2.dims = 2;
        m_2.h = 1;
        m_2.d = 1;
        m_2.c = 1;
        m_3.cstep = (size_t)local_178.w;
        m_3.data = local_178.data;
        m_3.refcount._0_4_ = 0;
        m_3.refcount._4_4_ = 0;
        m_3.elemsize._0_4_ = (undefined4)local_178.elemsize;
        m_3.elemsize._4_4_ = local_178.elemsize._4_4_;
        m_3.elempack = local_178.elempack;
        m_3.allocator = local_178.allocator;
        m_3.dims = 2;
        m_3.w = local_178.w;
        m_3.h = 1;
        m_3.d = 1;
        m_3.c = 1;
        if (this->int8_scale_term == 0) {
          m_8.w = (this->weight_xc_data).w;
          m_8.h = (this->weight_xc_data).h;
          m_8.c = (this->weight_xc_data).d;
          m_8.data = (this->weight_xc_data).data;
          uVar7 = (this->weight_xc_data).elemsize;
          m_8.elempack = (this->weight_xc_data).elempack;
          m_8.allocator = (this->weight_xc_data).allocator;
          m_8.refcount._0_4_ = 0;
          m_8.refcount._4_4_ = 0;
          m_8.elemsize._0_4_ = (undefined4)uVar7;
          m_8.elemsize._4_4_ = (undefined4)(uVar7 >> 0x20);
          m_8.d = 1;
          sVar6 = (long)m_8.h * (long)m_8.w;
          iVar5 = (this->weight_xc_data).dims;
          m_8.dims = iVar5 + -1;
          m_8.cstep = (uVar7 * sVar6 + 0xf & 0xfffffffffffffff0) / uVar7;
          if (iVar5 == 4) {
            m_8.cstep = sVar6;
          }
          m_9.w = (this->bias_c_data).w;
          m_9.h = (this->bias_c_data).h;
          m_9.c = (this->bias_c_data).d;
          m_9.data = (this->bias_c_data).data;
          uVar7 = (this->bias_c_data).elemsize;
          m_9.elempack = (this->bias_c_data).elempack;
          m_9.allocator = (this->bias_c_data).allocator;
          m_9.refcount._0_4_ = 0;
          m_9.refcount._4_4_ = 0;
          m_9.elemsize._0_4_ = (undefined4)uVar7;
          m_9.elemsize._4_4_ = (undefined4)(uVar7 >> 0x20);
          m_9.d = 1;
          sVar6 = (long)m_9.h * (long)m_9.w;
          iVar5 = (this->bias_c_data).dims;
          m_9.dims = iVar5 + -1;
          m_9.cstep = (uVar7 * sVar6 + 0xf & 0xfffffffffffffff0) / uVar7;
          if (iVar5 == 4) {
            m_9.cstep = sVar6;
          }
          m_10.w = (this->weight_hc_data).w;
          m_10.h = (this->weight_hc_data).h;
          m_10.c = (this->weight_hc_data).d;
          m_10.data = (this->weight_hc_data).data;
          uVar7 = (this->weight_hc_data).elemsize;
          m_10.elempack = (this->weight_hc_data).elempack;
          m_10.allocator = (this->weight_hc_data).allocator;
          m_10.refcount._0_4_ = 0;
          m_10.refcount._4_4_ = 0;
          m_10.elemsize._0_4_ = (undefined4)uVar7;
          m_10.elemsize._4_4_ = (undefined4)(uVar7 >> 0x20);
          m_10.d = 1;
          sVar6 = (long)m_10.h * (long)m_10.w;
          iVar5 = (this->weight_hc_data).dims;
          m_10.dims = iVar5 + -1;
          m_10.cstep = (uVar7 * sVar6 + 0xf & 0xfffffffffffffff0) / uVar7;
          if (iVar5 == 4) {
            m_10.cstep = sVar6;
          }
          if (this->num_output == this->hidden_size) {
            m_11.cstep = 0;
            m_11.data = (void *)0x0;
            m_11.elemsize._0_4_ = 0;
            m_11.elemsize._4_4_ = 0;
            m_11.elempack = 0;
            m_11.allocator = (Allocator *)0x0;
            m_11.dims = 0;
            m_11.w = 0;
            m_11.h = 0;
            m_11.d = 0;
            m_11.c = 0;
          }
          else {
            m_11.w = (this->weight_hr_data).w;
            m_11.h = (this->weight_hr_data).h;
            m_11.c = (this->weight_hr_data).d;
            m_11.data = (this->weight_hr_data).data;
            uVar7 = (this->weight_hr_data).elemsize;
            m_11.elempack = (this->weight_hr_data).elempack;
            m_11.allocator = (this->weight_hr_data).allocator;
            m_11.elemsize._0_4_ = (undefined4)uVar7;
            m_11.elemsize._4_4_ = (undefined4)(uVar7 >> 0x20);
            m_11.d = 1;
            iVar5 = (this->weight_hr_data).dims;
            m_11.dims = iVar5 + -1;
            m_11.cstep = (uVar7 * (long)m_11.h * (long)m_11.w + 0xf & 0xfffffffffffffff0) / uVar7;
            if (iVar5 == 4) {
              m_11.cstep = (long)m_11.h * (long)m_11.w;
            }
          }
          m_11.refcount._4_4_ = 0;
          m_11.refcount._0_4_ = 0;
          iVar5 = lstm(bottom_blob,&m,0,&m_8,&m_9,&m_10,&m_11,&m_2,&m_3,opt);
          piVar2 = (int *)CONCAT44(m_11.refcount._4_4_,m_11.refcount._0_4_);
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (m_11.allocator == (Allocator *)0x0) {
                if (m_11.data != (void *)0x0) {
                  free(m_11.data);
                }
              }
              else {
                (*(m_11.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          piVar2 = (int *)CONCAT44(m_10.refcount._4_4_,m_10.refcount._0_4_);
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (m_10.allocator == (Allocator *)0x0) {
                if (m_10.data != (void *)0x0) {
                  free(m_10.data);
                }
              }
              else {
                (*(m_10.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          m_10.cstep = 0;
          m_10.data = (void *)0x0;
          m_10.refcount._0_4_ = 0;
          m_10.refcount._4_4_ = 0;
          m_10.elemsize._0_4_ = 0;
          m_10.elemsize._4_4_ = 0;
          m_10.elempack = 0;
          m_10.dims = 0;
          m_10.w = 0;
          m_10.h = 0;
          m_10.d = 0;
          m_10.c = 0;
          piVar2 = (int *)CONCAT44(m_9.refcount._4_4_,m_9.refcount._0_4_);
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (m_9.allocator == (Allocator *)0x0) {
                if (m_9.data != (void *)0x0) {
                  free(m_9.data);
                }
              }
              else {
                (*(m_9.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          m_9.cstep = 0;
          m_9.data = (void *)0x0;
          m_9.refcount._0_4_ = 0;
          m_9.refcount._4_4_ = 0;
          m_9.elemsize._0_4_ = 0;
          m_9.elemsize._4_4_ = 0;
          m_9.elempack = 0;
          m_9.dims = 0;
          m_9.w = 0;
          m_9.h = 0;
          m_9.d = 0;
          m_9.c = 0;
          piVar2 = (int *)CONCAT44(m_8.refcount._4_4_,m_8.refcount._0_4_);
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (m_8.allocator == (Allocator *)0x0) goto joined_r0x00376a12;
              (*(m_8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        else {
          m_8.w = (this->weight_xc_data).w;
          m_8.h = (this->weight_xc_data).h;
          m_8.c = (this->weight_xc_data).d;
          m_8.data = (this->weight_xc_data).data;
          uVar7 = (this->weight_xc_data).elemsize;
          m_8.elempack = (this->weight_xc_data).elempack;
          m_8.allocator = (this->weight_xc_data).allocator;
          m_8.refcount._0_4_ = 0;
          m_8.refcount._4_4_ = 0;
          m_8.elemsize._0_4_ = (undefined4)uVar7;
          m_8.elemsize._4_4_ = (undefined4)(uVar7 >> 0x20);
          m_8.d = 1;
          sVar6 = (long)m_8.h * (long)m_8.w;
          iVar5 = (this->weight_xc_data).dims;
          m_8.dims = iVar5 + -1;
          m_8.cstep = (uVar7 * sVar6 + 0xf & 0xfffffffffffffff0) / uVar7;
          if (iVar5 == 4) {
            m_8.cstep = sVar6;
          }
          m_9.w = (this->bias_c_data).w;
          m_9.h = (this->bias_c_data).h;
          m_9.c = (this->bias_c_data).d;
          m_9.data = (this->bias_c_data).data;
          uVar7 = (this->bias_c_data).elemsize;
          m_9.elempack = (this->bias_c_data).elempack;
          m_9.allocator = (this->bias_c_data).allocator;
          m_9.refcount._0_4_ = 0;
          m_9.refcount._4_4_ = 0;
          m_9.elemsize._0_4_ = (undefined4)uVar7;
          m_9.elemsize._4_4_ = (undefined4)(uVar7 >> 0x20);
          m_9.d = 1;
          sVar6 = (long)m_9.h * (long)m_9.w;
          iVar5 = (this->bias_c_data).dims;
          m_9.dims = iVar5 + -1;
          m_9.cstep = (uVar7 * sVar6 + 0xf & 0xfffffffffffffff0) / uVar7;
          if (iVar5 == 4) {
            m_9.cstep = sVar6;
          }
          m_10.w = (this->weight_hc_data).w;
          m_10.h = (this->weight_hc_data).h;
          m_10.c = (this->weight_hc_data).d;
          m_10.data = (this->weight_hc_data).data;
          uVar7 = (this->weight_hc_data).elemsize;
          m_10.elempack = (this->weight_hc_data).elempack;
          m_10.allocator = (this->weight_hc_data).allocator;
          m_10.refcount._0_4_ = 0;
          m_10.refcount._4_4_ = 0;
          m_10.elemsize._0_4_ = (undefined4)uVar7;
          m_10.elemsize._4_4_ = (undefined4)(uVar7 >> 0x20);
          m_10.d = 1;
          sVar6 = (long)m_10.h * (long)m_10.w;
          iVar5 = (this->weight_hc_data).dims;
          m_10.dims = iVar5 + -1;
          m_10.cstep = (uVar7 * sVar6 + 0xf & 0xfffffffffffffff0) / uVar7;
          if (iVar5 == 4) {
            m_10.cstep = sVar6;
          }
          if (this->num_output == this->hidden_size) {
            m_11.cstep = 0;
            m_11.data = (void *)0x0;
            m_11.elemsize._0_4_ = 0;
            m_11.elemsize._4_4_ = 0;
            m_11.elempack = 0;
            m_11.allocator = (Allocator *)0x0;
            m_11.dims = 0;
            m_11.w = 0;
            m_11.h = 0;
            m_11.d = 0;
            m_11.c = 0;
          }
          else {
            m_11.w = (this->weight_hr_data).w;
            m_11.h = (this->weight_hr_data).h;
            m_11.c = (this->weight_hr_data).d;
            m_11.data = (this->weight_hr_data).data;
            uVar7 = (this->weight_hr_data).elemsize;
            m_11.elempack = (this->weight_hr_data).elempack;
            m_11.allocator = (this->weight_hr_data).allocator;
            m_11.elemsize._0_4_ = (undefined4)uVar7;
            m_11.elemsize._4_4_ = (undefined4)(uVar7 >> 0x20);
            m_11.d = 1;
            iVar5 = (this->weight_hr_data).dims;
            m_11.dims = iVar5 + -1;
            m_11.cstep = (uVar7 * (long)m_11.h * (long)m_11.w + 0xf & 0xfffffffffffffff0) / uVar7;
            if (iVar5 == 4) {
              m_11.cstep = (long)m_11.h * (long)m_11.w;
            }
          }
          m_11.refcount._4_4_ = 0;
          m_11.refcount._0_4_ = 0;
          iVar5 = lstm_int8(bottom_blob,&m,0,&m_8,(float *)(this->weight_xc_data_int8_scales).data,
                            &m_9,&m_10,(float *)(this->weight_hc_data_int8_scales).data,&m_11,&m_2,
                            &m_3,opt);
          piVar2 = (int *)CONCAT44(m_11.refcount._4_4_,m_11.refcount._0_4_);
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (m_11.allocator == (Allocator *)0x0) {
                if (m_11.data != (void *)0x0) {
                  free(m_11.data);
                }
              }
              else {
                (*(m_11.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          piVar2 = (int *)CONCAT44(m_10.refcount._4_4_,m_10.refcount._0_4_);
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (m_10.allocator == (Allocator *)0x0) {
                if (m_10.data != (void *)0x0) {
                  free(m_10.data);
                }
              }
              else {
                (*(m_10.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          m_10.cstep = 0;
          m_10.data = (void *)0x0;
          m_10.refcount._0_4_ = 0;
          m_10.refcount._4_4_ = 0;
          m_10.elemsize._0_4_ = 0;
          m_10.elemsize._4_4_ = 0;
          m_10.elempack = 0;
          m_10.dims = 0;
          m_10.w = 0;
          m_10.h = 0;
          m_10.d = 0;
          m_10.c = 0;
          piVar2 = (int *)CONCAT44(m_9.refcount._4_4_,m_9.refcount._0_4_);
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (m_9.allocator == (Allocator *)0x0) {
                if (m_9.data != (void *)0x0) {
                  free(m_9.data);
                }
              }
              else {
                (*(m_9.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          m_9.cstep = 0;
          m_9.data = (void *)0x0;
          m_9.refcount._0_4_ = 0;
          m_9.refcount._4_4_ = 0;
          m_9.elemsize._0_4_ = 0;
          m_9.elemsize._4_4_ = 0;
          m_9.elempack = 0;
          m_9.dims = 0;
          m_9.w = 0;
          m_9.h = 0;
          m_9.d = 0;
          m_9.c = 0;
          piVar2 = (int *)CONCAT44(m_8.refcount._4_4_,m_8.refcount._0_4_);
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (m_8.allocator == (Allocator *)0x0) {
joined_r0x00376a12:
                m_9.elempack = 0;
                m_9.elemsize._4_4_ = 0;
                m_9.elemsize._0_4_ = 0;
                m_9.refcount._4_4_ = 0;
                m_9.refcount._0_4_ = 0;
                m_9.c = 0;
                m_9.h = 0;
                m_9.d = 0;
                m_9.dims = 0;
                m_9.w = 0;
                m_9.data = (void *)0x0;
                m_9.cstep = 0;
                if (m_8.data != (void *)0x0) {
                  m_9.cstep = 0;
                  m_9.c = 0;
                  m_9.h = 0;
                  m_9.d = 0;
                  m_9.dims = 0;
                  m_9.w = 0;
                  m_9.elempack = 0;
                  m_9.elemsize._4_4_ = 0;
                  m_9.elemsize._0_4_ = 0;
                  m_9.refcount._4_4_ = 0;
                  m_9.refcount._0_4_ = 0;
                  m_9.data = (void *)0x0;
                  free(m_8.data);
                }
              }
              else {
                (*(m_8.allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
        if (iVar5 == 0) {
          m_8.cstep = (size_t)local_128.w;
          m_8.data = (void *)(CONCAT44(local_128.elemsize._4_4_,(undefined4)local_128.elemsize) *
                              m_8.cstep + (long)local_128.data);
          m_8.refcount._0_4_ = 0;
          m_8.refcount._4_4_ = 0;
          m_8.elemsize._0_4_ = (undefined4)local_128.elemsize;
          m_8.elemsize._4_4_ = local_128.elemsize._4_4_;
          m_8.elempack = local_128.elempack;
          m_8.allocator = local_128.allocator;
          m_8.w = local_128.w;
          m_8.dims = 2;
          m_8.h = 1;
          m_8.d = 1;
          m_8.c = 1;
          m_9.cstep = (size_t)local_178.w;
          m_9.data = (void *)(CONCAT44(local_178.elemsize._4_4_,(undefined4)local_178.elemsize) *
                              m_9.cstep + (long)local_178.data);
          m_9.refcount._0_4_ = 0;
          m_9.refcount._4_4_ = 0;
          m_9.elemsize._0_4_ = (undefined4)local_178.elemsize;
          m_9.elemsize._4_4_ = local_178.elemsize._4_4_;
          m_9.elempack = local_178.elempack;
          m_9.allocator = local_178.allocator;
          m_9.w = local_178.w;
          m_9.dims = 2;
          m_9.h = 1;
          m_9.d = 1;
          m_9.c = 1;
          if (this->int8_scale_term == 0) {
            m_10.w = (this->weight_xc_data).w;
            m_10.h = (this->weight_xc_data).h;
            m_10.c = (this->weight_xc_data).d;
            uVar7 = (this->weight_xc_data).elemsize;
            m_10.data = (void *)((this->weight_xc_data).cstep * uVar7 +
                                (long)(this->weight_xc_data).data);
            m_10.elempack = (this->weight_xc_data).elempack;
            m_10.allocator = (this->weight_xc_data).allocator;
            m_10.refcount._0_4_ = 0;
            m_10.refcount._4_4_ = 0;
            m_10.elemsize._0_4_ = (undefined4)uVar7;
            m_10.elemsize._4_4_ = (undefined4)(uVar7 >> 0x20);
            m_10.d = 1;
            sVar6 = (long)m_10.h * (long)m_10.w;
            iVar5 = (this->weight_xc_data).dims;
            m_10.dims = iVar5 + -1;
            m_10.cstep = (uVar7 * sVar6 + 0xf & 0xfffffffffffffff0) / uVar7;
            if (iVar5 == 4) {
              m_10.cstep = sVar6;
            }
            m_11.w = (this->bias_c_data).w;
            m_11.h = (this->bias_c_data).h;
            m_11.c = (this->bias_c_data).d;
            uVar7 = (this->bias_c_data).elemsize;
            m_11.data = (void *)((this->bias_c_data).cstep * uVar7 + (long)(this->bias_c_data).data)
            ;
            m_11.elempack = (this->bias_c_data).elempack;
            m_11.allocator = (this->bias_c_data).allocator;
            m_11.refcount._0_4_ = 0;
            m_11.refcount._4_4_ = 0;
            m_11.elemsize._0_4_ = (undefined4)uVar7;
            m_11.elemsize._4_4_ = (undefined4)(uVar7 >> 0x20);
            m_11.d = 1;
            iVar5 = (this->bias_c_data).dims;
            m_11.dims = iVar5 + -1;
            m_11.cstep = (uVar7 * (long)m_11.h * (long)m_11.w + 0xf & 0xfffffffffffffff0) / uVar7;
            if (iVar5 == 4) {
              m_11.cstep = (long)m_11.h * (long)m_11.w;
            }
            m_18.w = (this->weight_hc_data).w;
            m_18.h = (this->weight_hc_data).h;
            m_18.c = (this->weight_hc_data).d;
            uVar7 = (this->weight_hc_data).elemsize;
            m_18.data = (void *)((this->weight_hc_data).cstep * uVar7 +
                                (long)(this->weight_hc_data).data);
            m_18.elempack = (this->weight_hc_data).elempack;
            m_18.allocator = (this->weight_hc_data).allocator;
            m_18.refcount._0_4_ = 0;
            m_18.refcount._4_4_ = 0;
            m_18.elemsize._0_4_ = (undefined4)uVar7;
            m_18.elemsize._4_4_ = (undefined4)(uVar7 >> 0x20);
            m_18.d = 1;
            sVar6 = (long)m_18.h * (long)m_18.w;
            iVar5 = (this->weight_hc_data).dims;
            m_18.dims = iVar5 + -1;
            m_18.cstep = (uVar7 * sVar6 + 0xf & 0xfffffffffffffff0) / uVar7;
            if (iVar5 == 4) {
              m_18.cstep = sVar6;
            }
            if (this->num_output == this->hidden_size) {
              m_19.cstep = 0;
              m_19.data = (void *)0x0;
              m_19.elemsize._0_4_ = 0;
              m_19.elemsize._4_4_ = 0;
              m_19.elempack = 0;
              m_19.allocator = (Allocator *)0x0;
              m_19.dims = 0;
              m_19.w = 0;
              m_19.h = 0;
              m_19.d = 0;
              m_19.c = 0;
            }
            else {
              m_19.w = (this->weight_hr_data).w;
              m_19.h = (this->weight_hr_data).h;
              uVar7 = (this->weight_hr_data).elemsize;
              m_19.data = (void *)((this->weight_hr_data).cstep * uVar7 +
                                  (long)(this->weight_hr_data).data);
              m_19.elempack = (this->weight_hr_data).elempack;
              m_19.allocator = (this->weight_hr_data).allocator;
              m_19.elemsize._0_4_ = (undefined4)uVar7;
              m_19.elemsize._4_4_ = (undefined4)(uVar7 >> 0x20);
              m_19.c = (this->weight_hr_data).d;
              m_19.d = 1;
              iVar5 = (this->weight_hr_data).dims;
              m_19.dims = iVar5 + -1;
              m_19.cstep = (uVar7 * (long)m_19.h * (long)m_19.w + 0xf & 0xfffffffffffffff0) / uVar7;
              if (iVar5 == 4) {
                m_19.cstep = (long)m_19.h * (long)m_19.w;
              }
            }
            m_19.refcount._4_4_ = 0;
            m_19.refcount._0_4_ = 0;
            iVar5 = lstm(bottom_blob,&m_1,1,&m_10,&m_11,&m_18,&m_19,&m_8,&m_9,opt);
            piVar2 = (int *)CONCAT44(m_19.refcount._4_4_,m_19.refcount._0_4_);
            if (piVar2 != (int *)0x0) {
              LOCK();
              *piVar2 = *piVar2 + -1;
              UNLOCK();
              if (*piVar2 == 0) {
                if (m_19.allocator == (Allocator *)0x0) {
                  if (m_19.data != (void *)0x0) {
                    free(m_19.data);
                  }
                }
                else {
                  (*(m_19.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            piVar2 = (int *)CONCAT44(m_18.refcount._4_4_,m_18.refcount._0_4_);
            if (piVar2 != (int *)0x0) {
              LOCK();
              *piVar2 = *piVar2 + -1;
              UNLOCK();
              if (*piVar2 == 0) {
                if (m_18.allocator == (Allocator *)0x0) {
                  if (m_18.data != (void *)0x0) {
                    free(m_18.data);
                  }
                }
                else {
                  (*(m_18.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            m_18.cstep = 0;
            m_18.data = (void *)0x0;
            m_18.refcount._0_4_ = 0;
            m_18.refcount._4_4_ = 0;
            m_18.elemsize._0_4_ = 0;
            m_18.elemsize._4_4_ = 0;
            m_18.elempack = 0;
            m_18.dims = 0;
            m_18.w = 0;
            m_18.h = 0;
            m_18.d = 0;
            m_18.c = 0;
            piVar2 = (int *)CONCAT44(m_11.refcount._4_4_,m_11.refcount._0_4_);
            if (piVar2 != (int *)0x0) {
              LOCK();
              *piVar2 = *piVar2 + -1;
              UNLOCK();
              if (*piVar2 == 0) {
                if (m_11.allocator == (Allocator *)0x0) {
                  if (m_11.data != (void *)0x0) {
                    free(m_11.data);
                  }
                }
                else {
                  (*(m_11.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            m_11.cstep = 0;
            m_11.data = (void *)0x0;
            m_11.refcount._0_4_ = 0;
            m_11.refcount._4_4_ = 0;
            m_11.elemsize._0_4_ = 0;
            m_11.elemsize._4_4_ = 0;
            m_11.elempack = 0;
            m_11.dims = 0;
            m_11.w = 0;
            m_11.h = 0;
            m_11.d = 0;
            m_11.c = 0;
            piVar2 = (int *)CONCAT44(m_10.refcount._4_4_,m_10.refcount._0_4_);
            if (piVar2 != (int *)0x0) {
              LOCK();
              *piVar2 = *piVar2 + -1;
              UNLOCK();
              if (*piVar2 == 0) {
                if (m_10.allocator == (Allocator *)0x0) goto joined_r0x003775b2;
                (*(m_10.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          else {
            m_10.w = (this->weight_xc_data).w;
            m_10.h = (this->weight_xc_data).h;
            m_10.c = (this->weight_xc_data).d;
            uVar7 = (this->weight_xc_data).elemsize;
            m_10.data = (void *)((this->weight_xc_data).cstep * uVar7 +
                                (long)(this->weight_xc_data).data);
            m_10.elempack = (this->weight_xc_data).elempack;
            m_10.allocator = (this->weight_xc_data).allocator;
            m_10.refcount._0_4_ = 0;
            m_10.refcount._4_4_ = 0;
            m_10.elemsize._0_4_ = (undefined4)uVar7;
            m_10.elemsize._4_4_ = (undefined4)(uVar7 >> 0x20);
            m_10.d = 1;
            sVar6 = (long)m_10.h * (long)m_10.w;
            iVar5 = (this->weight_xc_data).dims;
            m_10.dims = iVar5 + -1;
            m_10.cstep = (uVar7 * sVar6 + 0xf & 0xfffffffffffffff0) / uVar7;
            if (iVar5 == 4) {
              m_10.cstep = sVar6;
            }
            m_11.w = (this->bias_c_data).w;
            m_11.h = (this->bias_c_data).h;
            m_11.c = (this->bias_c_data).d;
            uVar7 = (this->bias_c_data).elemsize;
            m_11.data = (void *)((this->bias_c_data).cstep * uVar7 + (long)(this->bias_c_data).data)
            ;
            m_11.elempack = (this->bias_c_data).elempack;
            m_11.allocator = (this->bias_c_data).allocator;
            m_11.refcount._0_4_ = 0;
            m_11.refcount._4_4_ = 0;
            m_11.elemsize._0_4_ = (undefined4)uVar7;
            m_11.elemsize._4_4_ = (undefined4)(uVar7 >> 0x20);
            m_11.d = 1;
            iVar5 = (this->bias_c_data).dims;
            m_11.dims = iVar5 + -1;
            m_11.cstep = (uVar7 * (long)m_11.h * (long)m_11.w + 0xf & 0xfffffffffffffff0) / uVar7;
            if (iVar5 == 4) {
              m_11.cstep = (long)m_11.h * (long)m_11.w;
            }
            m_18.w = (this->weight_hc_data).w;
            m_18.h = (this->weight_hc_data).h;
            m_18.c = (this->weight_hc_data).d;
            uVar7 = (this->weight_hc_data).elemsize;
            m_18.data = (void *)((this->weight_hc_data).cstep * uVar7 +
                                (long)(this->weight_hc_data).data);
            m_18.elempack = (this->weight_hc_data).elempack;
            m_18.allocator = (this->weight_hc_data).allocator;
            m_18.refcount._0_4_ = 0;
            m_18.refcount._4_4_ = 0;
            m_18.elemsize._0_4_ = (undefined4)uVar7;
            m_18.elemsize._4_4_ = (undefined4)(uVar7 >> 0x20);
            m_18.d = 1;
            sVar6 = (long)m_18.h * (long)m_18.w;
            iVar5 = (this->weight_hc_data).dims;
            m_18.dims = iVar5 + -1;
            m_18.cstep = (uVar7 * sVar6 + 0xf & 0xfffffffffffffff0) / uVar7;
            if (iVar5 == 4) {
              m_18.cstep = sVar6;
            }
            if (this->num_output == this->hidden_size) {
              m_19.cstep = 0;
              m_19.data = (void *)0x0;
              m_19.elemsize._0_4_ = 0;
              m_19.elemsize._4_4_ = 0;
              m_19.elempack = 0;
              m_19.allocator = (Allocator *)0x0;
              m_19.dims = 0;
              m_19.w = 0;
              m_19.h = 0;
              m_19.d = 0;
              m_19.c = 0;
            }
            else {
              m_19.w = (this->weight_hr_data).w;
              m_19.h = (this->weight_hr_data).h;
              uVar7 = (this->weight_hr_data).elemsize;
              m_19.data = (void *)((this->weight_hr_data).cstep * uVar7 +
                                  (long)(this->weight_hr_data).data);
              m_19.elempack = (this->weight_hr_data).elempack;
              m_19.allocator = (this->weight_hr_data).allocator;
              m_19.elemsize._0_4_ = (undefined4)uVar7;
              m_19.elemsize._4_4_ = (undefined4)(uVar7 >> 0x20);
              m_19.c = (this->weight_hr_data).d;
              m_19.d = 1;
              iVar5 = (this->weight_hr_data).dims;
              m_19.dims = iVar5 + -1;
              m_19.cstep = (uVar7 * (long)m_19.h * (long)m_19.w + 0xf & 0xfffffffffffffff0) / uVar7;
              if (iVar5 == 4) {
                m_19.cstep = (long)m_19.h * (long)m_19.w;
              }
            }
            m_19.refcount._4_4_ = 0;
            m_19.refcount._0_4_ = 0;
            iVar5 = lstm_int8(bottom_blob,&m_1,1,&m_10,
                              (float *)((long)(this->weight_xc_data_int8_scales).w *
                                        (this->weight_xc_data_int8_scales).elemsize +
                                       (long)(this->weight_xc_data_int8_scales).data),&m_11,&m_18,
                              (float *)((long)(this->weight_hc_data_int8_scales).w *
                                        (this->weight_hc_data_int8_scales).elemsize +
                                       (long)(this->weight_hc_data_int8_scales).data),&m_19,&m_8,
                              &m_9,opt);
            piVar2 = (int *)CONCAT44(m_19.refcount._4_4_,m_19.refcount._0_4_);
            if (piVar2 != (int *)0x0) {
              LOCK();
              *piVar2 = *piVar2 + -1;
              UNLOCK();
              if (*piVar2 == 0) {
                if (m_19.allocator == (Allocator *)0x0) {
                  if (m_19.data != (void *)0x0) {
                    free(m_19.data);
                  }
                }
                else {
                  (*(m_19.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            piVar2 = (int *)CONCAT44(m_18.refcount._4_4_,m_18.refcount._0_4_);
            if (piVar2 != (int *)0x0) {
              LOCK();
              *piVar2 = *piVar2 + -1;
              UNLOCK();
              if (*piVar2 == 0) {
                if (m_18.allocator == (Allocator *)0x0) {
                  if (m_18.data != (void *)0x0) {
                    free(m_18.data);
                  }
                }
                else {
                  (*(m_18.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            m_18.cstep = 0;
            m_18.data = (void *)0x0;
            m_18.refcount._0_4_ = 0;
            m_18.refcount._4_4_ = 0;
            m_18.elemsize._0_4_ = 0;
            m_18.elemsize._4_4_ = 0;
            m_18.elempack = 0;
            m_18.dims = 0;
            m_18.w = 0;
            m_18.h = 0;
            m_18.d = 0;
            m_18.c = 0;
            piVar2 = (int *)CONCAT44(m_11.refcount._4_4_,m_11.refcount._0_4_);
            if (piVar2 != (int *)0x0) {
              LOCK();
              *piVar2 = *piVar2 + -1;
              UNLOCK();
              if (*piVar2 == 0) {
                if (m_11.allocator == (Allocator *)0x0) {
                  if (m_11.data != (void *)0x0) {
                    free(m_11.data);
                  }
                }
                else {
                  (*(m_11.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            m_11.cstep = 0;
            m_11.data = (void *)0x0;
            m_11.refcount._0_4_ = 0;
            m_11.refcount._4_4_ = 0;
            m_11.elemsize._0_4_ = 0;
            m_11.elemsize._4_4_ = 0;
            m_11.elempack = 0;
            m_11.dims = 0;
            m_11.w = 0;
            m_11.h = 0;
            m_11.d = 0;
            m_11.c = 0;
            piVar2 = (int *)CONCAT44(m_10.refcount._4_4_,m_10.refcount._0_4_);
            if (piVar2 != (int *)0x0) {
              LOCK();
              *piVar2 = *piVar2 + -1;
              UNLOCK();
              if (*piVar2 == 0) {
                if (m_10.allocator == (Allocator *)0x0) {
joined_r0x003775b2:
                  m_11.d = 0;
                  m_11.h = 0;
                  m_11.w = 0;
                  m_11.dims = 0;
                  m_11.elempack = 0;
                  m_11.elemsize._4_4_ = 0;
                  m_11.elemsize._0_4_ = 0;
                  m_11.refcount._4_4_ = 0;
                  m_11.refcount._0_4_ = 0;
                  m_11.c = 0;
                  m_11.data = (void *)0x0;
                  m_11.cstep = 0;
                  if (m_10.data != (void *)0x0) {
                    m_11.cstep = 0;
                    m_11.c = 0;
                    m_11.d = 0;
                    m_11.h = 0;
                    m_11.w = 0;
                    m_11.dims = 0;
                    m_11.elempack = 0;
                    m_11.elemsize._4_4_ = 0;
                    m_11.elemsize._0_4_ = 0;
                    m_11.refcount._4_4_ = 0;
                    m_11.refcount._0_4_ = 0;
                    m_11.data = (void *)0x0;
                    free(m_10.data);
                  }
                }
                else {
                  (*(m_10.allocator)->_vptr_Allocator[3])();
                }
              }
            }
          }
          m_10.cstep = 0;
          m_10.data = (void *)0x0;
          m_10.refcount._0_4_ = 0;
          m_10.refcount._4_4_ = 0;
          m_10.elemsize._0_4_ = 0;
          m_10.elemsize._4_4_ = 0;
          m_10.elempack = 0;
          m_10.dims = 0;
          m_10.w = 0;
          m_10.h = 0;
          m_10.d = 0;
          m_10.c = 0;
          if (iVar5 == 0) {
            bVar3 = true;
            iVar5 = iVar4;
            if (0 < (int)_h) {
              uVar7 = 0;
              do {
                __src = (void *)((long)m_1.w * uVar7 *
                                 CONCAT44(m_1.elemsize._4_4_,(undefined4)m_1.elemsize) +
                                (long)m_1.data);
                __dest = (void *)((long)this_00->w * uVar7 * this_00->elemsize + (long)this_00->data
                                 );
                memcpy(__dest,(void *)((long)m.w * uVar7 *
                                       CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize) +
                                      (long)m.data),(long)this->num_output << 2);
                memcpy((void *)((long)this->num_output * 4 + (long)__dest),__src,
                       (long)this->num_output << 2);
                uVar7 = uVar7 + 1;
              } while (_h != uVar7);
              bVar3 = true;
            }
          }
          else {
            bVar3 = false;
          }
          piVar2 = (int *)CONCAT44(m_9.refcount._4_4_,m_9.refcount._0_4_);
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (m_9.allocator == (Allocator *)0x0) {
                if (m_9.data != (void *)0x0) {
                  free(m_9.data);
                }
              }
              else {
                (*(m_9.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          m_9.cstep = 0;
          m_9.data = (void *)0x0;
          m_9.refcount._0_4_ = 0;
          m_9.refcount._4_4_ = 0;
          m_9.elemsize._0_4_ = 0;
          m_9.elemsize._4_4_ = 0;
          m_9.elempack = 0;
          m_9.dims = 0;
          m_9.w = 0;
          m_9.h = 0;
          m_9.d = 0;
          m_9.c = 0;
          piVar2 = (int *)CONCAT44(m_8.refcount._4_4_,m_8.refcount._0_4_);
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (m_8.allocator == (Allocator *)0x0) {
                if (m_8.data != (void *)0x0) {
                  free(m_8.data);
                }
              }
              else {
                (*(m_8.allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
        else {
          bVar3 = false;
        }
        m_8.cstep = 0;
        m_8.c = 0;
        m_8.h = 0;
        m_8.d = 0;
        m_8.dims = 0;
        m_8.w = 0;
        m_8.elempack = 0;
        m_8.elemsize._4_4_ = 0;
        m_8.elemsize._0_4_ = 0;
        m_8.refcount._4_4_ = 0;
        m_8.refcount._0_4_ = 0;
        m_8.data = (void *)0x0;
        piVar2 = (int *)CONCAT44(m_3.refcount._4_4_,m_3.refcount._0_4_);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (m_3.allocator == (Allocator *)0x0) {
              if (m_3.data != (void *)0x0) {
                free(m_3.data);
              }
            }
            else {
              (*(m_3.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        m_3.cstep = 0;
        m_3.data = (void *)0x0;
        m_3.refcount._0_4_ = 0;
        m_3.refcount._4_4_ = 0;
        m_3.elemsize._0_4_ = 0;
        m_3.elemsize._4_4_ = 0;
        m_3.elempack = 0;
        m_3.dims = 0;
        m_3.w = 0;
        m_3.h = 0;
        m_3.d = 0;
        m_3.c = 0;
        piVar2 = (int *)CONCAT44(m_2.refcount._4_4_,m_2.refcount._0_4_);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (m_2.allocator == (Allocator *)0x0) {
              if (m_2.data != (void *)0x0) {
                free(m_2.data);
              }
            }
            else {
              (*(m_2.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        m_2.cstep = 0;
        m_2.data = (void *)0x0;
        m_2.refcount._0_4_ = 0;
        m_2.refcount._4_4_ = 0;
        m_2.elemsize._0_4_ = 0;
        m_2.elemsize._4_4_ = 0;
        m_2.elempack = 0;
        m_2.dims = 0;
        m_2.w = 0;
        m_2.h = 0;
        m_2.d = 0;
        m_2.c = 0;
      }
      piVar2 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (m_1.allocator == (Allocator *)0x0) {
            if (m_1.data != (void *)0x0) {
              free(m_1.data);
            }
          }
          else {
            (*(m_1.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      m_1.cstep = 0;
      m_1.data = (void *)0x0;
      m_1.refcount._0_4_ = 0;
      m_1.refcount._4_4_ = 0;
      m_1.elemsize._0_4_ = 0;
      m_1.elemsize._4_4_ = 0;
      m_1.elempack = 0;
      m_1.dims = 0;
      m_1.w = 0;
      m_1.h = 0;
      m_1.d = 0;
      m_1.c = 0;
    }
    piVar2 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (m.allocator == (Allocator *)0x0) {
          if (m.data != (void *)0x0) {
            free(m.data);
          }
        }
        else {
          (*(m.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    m.cstep = 0;
    m.data = (void *)0x0;
    m.refcount._0_4_ = 0;
    m.refcount._4_4_ = 0;
    m.elemsize._0_4_ = 0;
    m.elemsize._4_4_ = 0;
    m.elempack = 0;
    m.dims = 0;
    m.w = 0;
    m.h = 0;
    m.d = 0;
    m.c = 0;
    if (!bVar3) goto LAB_00377afb;
  }
  pMVar1 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar5 = 0;
  if ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)pMVar1 == 0xd8) {
    if (pMVar1 + 1 != &local_128) {
      piVar2 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      piVar2 = pMVar1[1].refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (pMVar1[1].allocator == (Allocator *)0x0) {
            if (pMVar1[1].data != (void *)0x0) {
              free(pMVar1[1].data);
            }
          }
          else {
            (*(pMVar1[1].allocator)->_vptr_Allocator[3])();
          }
        }
      }
      pMVar1[1].cstep = 0;
      *(undefined8 *)((long)&pMVar1[1].refcount + 4) = 0;
      *(undefined8 *)((long)&pMVar1[1].elemsize + 4) = 0;
      pMVar1[1].data = (void *)0x0;
      pMVar1[1].refcount = (int *)0x0;
      pMVar1[1].dims = 0;
      pMVar1[1].w = 0;
      pMVar1[1].h = 0;
      pMVar1[1].d = 0;
      pMVar1[1].c = 0;
      pMVar1[1].data = local_128.data;
      pMVar1[1].refcount = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
      pMVar1[1].elemsize = CONCAT44(local_128.elemsize._4_4_,(undefined4)local_128.elemsize);
      pMVar1[1].elempack = local_128.elempack;
      pMVar1[1].allocator = local_128.allocator;
      pMVar1[1].dims = local_128.dims;
      pMVar1[1].w = local_128.w;
      pMVar1[1].h = local_128.h;
      pMVar1[1].d = local_128.d;
      pMVar1[1].c = local_128.c;
      pMVar1[1].cstep = local_128.cstep;
    }
    pMVar1 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (pMVar1 + 2 != &local_178) {
      piVar2 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      piVar2 = pMVar1[2].refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (pMVar1[2].allocator == (Allocator *)0x0) {
            if (pMVar1[2].data != (void *)0x0) {
              free(pMVar1[2].data);
            }
          }
          else {
            (*(pMVar1[2].allocator)->_vptr_Allocator[3])();
          }
        }
      }
      pMVar1[2].cstep = 0;
      *(undefined8 *)((long)&pMVar1[2].refcount + 4) = 0;
      *(undefined8 *)((long)&pMVar1[2].elemsize + 4) = 0;
      pMVar1[2].data = (void *)0x0;
      pMVar1[2].refcount = (int *)0x0;
      pMVar1[2].dims = 0;
      pMVar1[2].w = 0;
      pMVar1[2].h = 0;
      pMVar1[2].d = 0;
      pMVar1[2].c = 0;
      pMVar1[2].data = local_178.data;
      pMVar1[2].refcount = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
      pMVar1[2].elemsize = CONCAT44(local_178.elemsize._4_4_,(undefined4)local_178.elemsize);
      pMVar1[2].elempack = local_178.elempack;
      pMVar1[2].allocator = local_178.allocator;
      pMVar1[2].dims = local_178.dims;
      pMVar1[2].w = local_178.w;
      pMVar1[2].h = local_178.h;
      pMVar1[2].d = local_178.d;
      pMVar1[2].c = local_178.c;
      pMVar1[2].cstep = local_178.cstep;
      iVar5 = 0;
    }
  }
LAB_00377afb:
  piVar2 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (local_178.allocator == (Allocator *)0x0) {
        if (local_178.data != (void *)0x0) {
          free(local_178.data);
        }
      }
      else {
        (*(local_178.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_178.cstep = 0;
  local_178.data = (void *)0x0;
  local_178.refcount._0_4_ = 0;
  local_178.refcount._4_4_ = 0;
  local_178.elemsize._0_4_ = 0;
  local_178.elemsize._4_4_ = 0;
  local_178.elempack = 0;
  local_178.dims = 0;
  local_178.w = 0;
  local_178.h = 0;
  local_178.d = 0;
  local_178.c = 0;
  piVar2 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (local_128.allocator == (Allocator *)0x0) {
        if (local_128.data != (void *)0x0) {
          free(local_128.data);
        }
      }
      else {
        (*(local_128.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar5;
}

Assistant:

int LSTM::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int T = bottom_blob.h;
    int num_directions = direction == 2 ? 2 : 1;

    Mat hidden;
    Mat cell;
    Allocator* hidden_cell_allocator = top_blobs.size() == 3 ? opt.blob_allocator : opt.workspace_allocator;
    if (bottom_blobs.size() == 3)
    {
        hidden = bottom_blobs[1].clone(hidden_cell_allocator);
        cell = bottom_blobs[2].clone(hidden_cell_allocator);
    }
    else
    {
        hidden.create(num_output, num_directions, 4u, hidden_cell_allocator);
        if (hidden.empty())
            return -100;
        hidden.fill(0.f);

        cell.create(hidden_size, num_directions, 4u, hidden_cell_allocator);
        if (cell.empty())
            return -100;
        cell.fill(0.f);
    }

    Mat& top_blob = top_blobs[0];
    top_blob.create(num_output * num_directions, T, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // Uni directional
    if (direction == 0 || direction == 1)
    {
#if NCNN_INT8
        if (int8_scale_term)
        {
            int ret = lstm_int8(bottom_blob, top_blob, direction, weight_xc_data.channel(0), weight_xc_data_int8_scales.row(0), bias_c_data.channel(0), weight_hc_data.channel(0), weight_hc_data_int8_scales.row(0), num_output == hidden_size ? Mat() : weight_hr_data.channel(0), hidden, cell, opt);
            if (ret != 0)
                return ret;
        }
        else
#endif
        {
            int ret = lstm(bottom_blob, top_blob, direction, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), num_output == hidden_size ? Mat() : weight_hr_data.channel(0), hidden, cell, opt);
            if (ret != 0)
                return ret;
        }
    }

    if (direction == 2)
    {
        Mat top_blob_forward(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_forward.empty())
            return -100;

        Mat top_blob_reverse(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_reverse.empty())
            return -100;

        Mat hidden0 = hidden.row_range(0, 1);
        Mat cell0 = cell.row_range(0, 1);
#if NCNN_INT8
        if (int8_scale_term)
        {
            int ret = lstm_int8(bottom_blob, top_blob_forward, 0, weight_xc_data.channel(0), weight_xc_data_int8_scales.row(0), bias_c_data.channel(0), weight_hc_data.channel(0), weight_hc_data_int8_scales.row(0), num_output == hidden_size ? Mat() : weight_hr_data.channel(0), hidden0, cell0, opt);
            if (ret != 0)
                return ret;
        }
        else
#endif
        {
            int ret = lstm(bottom_blob, top_blob_forward, 0, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), num_output == hidden_size ? Mat() : weight_hr_data.channel(0), hidden0, cell0, opt);
            if (ret != 0)
                return ret;
        }

        Mat hidden1 = hidden.row_range(1, 1);
        Mat cell1 = cell.row_range(1, 1);
#if NCNN_INT8
        if (int8_scale_term)
        {
            int ret = lstm_int8(bottom_blob, top_blob_reverse, 1, weight_xc_data.channel(1), weight_xc_data_int8_scales.row(1), bias_c_data.channel(1), weight_hc_data.channel(1), weight_hc_data_int8_scales.row(1), num_output == hidden_size ? Mat() : weight_hr_data.channel(1), hidden1, cell1, opt);
            if (ret != 0)
                return ret;
        }
        else
#endif
        {
            int ret = lstm(bottom_blob, top_blob_reverse, 1, weight_xc_data.channel(1), bias_c_data.channel(1), weight_hc_data.channel(1), num_output == hidden_size ? Mat() : weight_hr_data.channel(1), hidden1, cell1, opt);
            if (ret != 0)
                return ret;
        }

        // concat w
        for (int i = 0; i < T; i++)
        {
            const float* pf = top_blob_forward.row(i);
            const float* pr = top_blob_reverse.row(i);
            float* ptr = top_blob.row(i);

            memcpy(ptr, pf, num_output * sizeof(float));
            memcpy(ptr + num_output, pr, num_output * sizeof(float));
        }
    }

    if (top_blobs.size() == 3)
    {
        top_blobs[1] = hidden;
        top_blobs[2] = cell;
    }

    return 0;
}